

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void write_data_crc(FILE *fp,DataCrc *crc)

{
  uint local_1c;
  RK_U32 loop;
  DataCrc *crc_local;
  FILE *fp_local;
  
  if (fp != (FILE *)0x0) {
    fprintf((FILE *)fp,"%08d,",(ulong)crc->len);
    for (local_1c = 0; local_1c < crc->sum_cnt; local_1c = local_1c + 1) {
      fprintf((FILE *)fp," %lx,",crc->sum[local_1c]);
    }
    fprintf((FILE *)fp," %08x\n",(ulong)crc->vor);
    fflush((FILE *)fp);
  }
  return;
}

Assistant:

void write_data_crc(FILE *fp, DataCrc *crc)
{
    RK_U32 loop = 0;

    if (fp) {
        fprintf(fp, "%08d,", crc->len);
        for (loop = 0; loop < crc->sum_cnt; loop++) {
            fprintf(fp, " %lx,", crc->sum[loop]);
        }
        fprintf(fp, " %08x\n", crc->vor);
        fflush(fp);
    }
}